

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myentity.hpp
# Opt level: O0

void __thiscall MyEntity::MyEntity(MyEntity *this,MyEntity *obj)

{
  MyEntity *in_RDI;
  Entity *in_stack_000001b8;
  Entity *in_stack_000001c0;
  GEvent<MyEntity> *e;
  GEvent<MyEntity> *in_stack_ffffffffffffffe0;
  
  MetaSim::Entity::Entity(in_stack_000001c0,in_stack_000001b8);
  (in_RDI->super_Entity)._vptr_Entity = (_func_int **)&PTR__MyEntity_00226330;
  e = &in_RDI->eventA;
  MetaSim::GEvent<MyEntity>::GEvent(in_stack_ffffffffffffffe0,e,in_RDI);
  MetaSim::GEvent<MyEntity>::GEvent(in_stack_ffffffffffffffe0,e,in_RDI);
  MetaSim::GEvent<MyEntity>::GEvent(in_stack_ffffffffffffffe0,e,in_RDI);
  return;
}

Assistant:

MyEntity(const MyEntity &obj) :
        Entity(obj),
        eventA(obj.eventA, *this),
        eventB(obj.eventB, *this),
        eventC(obj.eventC, *this)
        {}